

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndFrame(void)

{
  ImVector<ImGuiWindow_*> *this;
  ImVector<ImGuiWindow_*> *this_00;
  ImVec2 IVar1;
  _func_void_int_int *p_Var2;
  char *text;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ImVec2 in_RAX;
  ImGuiWindow *pIVar9;
  ImGuiWindow **ppIVar10;
  char *pcVar11;
  ImGuiContext *g;
  int i;
  int iVar12;
  char *label;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xfe9,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  if (GImGui->WithinFrameScope == false) {
    __assert_fail("g.WithinFrameScope && \"Forgot to call ImGui::NewFrame()?\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xfec,"void ImGui::EndFrame()");
  }
  p_Var2 = (GImGui->IO).ImeSetInputScreenPosFn;
  local_38 = in_RAX;
  if (p_Var2 != (_func_void_int_int *)0x0) {
    fVar13 = (GImGui->PlatformImeLastPos).x;
    if ((fVar13 != 3.4028235e+38) || (NAN(fVar13))) {
      fVar14 = (GImGui->PlatformImePos).x;
      fVar15 = (GImGui->PlatformImePos).y;
      fVar16 = (GImGui->PlatformImeLastPos).y - fVar15;
      if ((fVar13 - fVar14) * (fVar13 - fVar14) + fVar16 * fVar16 <= 0.0001) goto LAB_001d06f3;
    }
    else {
      fVar14 = (GImGui->PlatformImePos).x;
      fVar15 = (GImGui->PlatformImePos).y;
    }
    (*p_Var2)((int)fVar14,(int)fVar15);
    pIVar5->PlatformImeLastPos = pIVar5->PlatformImePos;
  }
LAB_001d06f3:
  iVar12 = (GImGui->CurrentWindowStack).Size;
  if (iVar12 != 1) {
    if (1 < iVar12) {
      __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x1bd8,"void ImGui::ErrorCheckEndFrame()");
    }
    __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x1bde,"void ImGui::ErrorCheckEndFrame()");
  }
  pIVar5->WithinFrameScopeWithImplicitWindow = false;
  pIVar9 = pIVar5->CurrentWindow;
  if ((pIVar9 != (ImGuiWindow *)0x0) && (pIVar9->WriteAccessed == false)) {
    pIVar9->Active = false;
  }
  End();
  pIVar4 = GImGui;
  if (pIVar5->NavWindowingTarget != (ImGuiWindow *)0x0) {
    if (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindowingTarget != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x22b8,"void ImGui::NavUpdateWindowingOverlay()");
    }
    if (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15) {
      if (GImGui->NavWindowingList == (ImGuiWindow *)0x0) {
        pIVar9 = FindWindowByName("###NavWindowingList");
        pIVar4->NavWindowingList = pIVar9;
      }
      IVar1 = (pIVar4->IO).DisplaySize;
      fVar13 = IVar1.x;
      fVar14 = IVar1.y;
      IVar3.y = fVar14 * 0.2;
      IVar3.x = fVar13 * 0.2;
      (pIVar4->NextWindowData).SizeConstraintRect.Min = IVar3;
      (pIVar4->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
      (pIVar4->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
      (pIVar4->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
      (pIVar4->NextWindowData).SizeCallbackUserData = (void *)0x0;
      *(byte *)&(pIVar4->NextWindowData).Flags = (byte)(pIVar4->NextWindowData).Flags | 0x11;
      IVar1.y = fVar14 * 0.5;
      IVar1.x = fVar13 * 0.5;
      (pIVar4->NextWindowData).PosVal = IVar1;
      (pIVar4->NextWindowData).PosPivotVal.x = 0.5;
      (pIVar4->NextWindowData).PosPivotVal.y = 0.5;
      (pIVar4->NextWindowData).PosCond = 1;
      IVar1 = (pIVar4->Style).WindowPadding;
      fVar13 = IVar1.x;
      fVar14 = IVar1.y;
      local_38.y = fVar14 + fVar14;
      local_38.x = fVar13 + fVar13;
      PushStyleVar(1,&local_38);
      Begin("###NavWindowingList",(bool *)0x0,0xc1347);
      iVar12 = (pIVar4->WindowsFocusOrder).Size;
      while (0 < iVar12) {
        iVar12 = iVar12 + -1;
        ppIVar10 = ImVector<ImGuiWindow_*>::operator[](&pIVar4->WindowsFocusOrder,iVar12);
        pIVar9 = *ppIVar10;
        bVar6 = IsWindowNavFocusable(pIVar9);
        if (bVar6) {
          text = pIVar9->Name;
          pcVar11 = FindRenderedTextEnd(text,(char *)0x0);
          label = text;
          if (text == pcVar11) {
            label = "(Popup)";
            if (((uint)pIVar9->Flags >> 0x1a & 1) == 0) {
              if (((uint)pIVar9->Flags >> 10 & 1) != 0) {
                iVar8 = strcmp(text,"##MainMenuBar");
                label = "(Main menu bar)";
                if (iVar8 == 0) goto LAB_001d088b;
              }
              label = "(Untitled)";
            }
          }
LAB_001d088b:
          local_38.x = 0.0;
          local_38.y = 0.0;
          Selectable(label,pIVar4->NavWindowingTarget == pIVar9,0,&local_38);
        }
      }
      End();
      PopStyleVar(1);
    }
  }
  if (pIVar5->DragDropActive != true) goto LAB_001d0905;
  bVar6 = (pIVar5->DragDropPayload).Delivery;
  if ((pIVar5->DragDropPayload).DataFrameCount + 1 < pIVar5->FrameCount) {
    if ((pIVar5->DragDropSourceFlags & 0x20) == 0) {
      bVar7 = IsMouseDown(pIVar5->DragDropMouseButton);
      bVar7 = !bVar7;
      goto LAB_001d08f8;
    }
  }
  else {
    bVar7 = false;
LAB_001d08f8:
    if ((!bVar7) && (bVar6 == false)) goto LAB_001d0905;
  }
  ClearDragDrop();
LAB_001d0905:
  iVar12 = pIVar5->FrameCount;
  if ((pIVar5->DragDropActive == true) && (pIVar5->DragDropSourceFrameCount < iVar12)) {
    pIVar5->DragDropWithinSourceOrTarget = true;
    SetTooltip("...");
    pIVar5->DragDropWithinSourceOrTarget = false;
    iVar12 = pIVar5->FrameCount;
  }
  pIVar5->WithinFrameScope = false;
  pIVar5->FrameCountEnded = iVar12;
  UpdateMouseMovingWindowEndFrame();
  this = &pIVar5->WindowsSortBuffer;
  ImVector<ImGuiWindow_*>::resize(this,0);
  this_00 = &pIVar5->Windows;
  ImVector<ImGuiWindow_*>::reserve(this,(pIVar5->Windows).Size);
  for (iVar12 = 0; iVar12 != this_00->Size; iVar12 = iVar12 + 1) {
    ppIVar10 = ImVector<ImGuiWindow_*>::operator[](this_00,iVar12);
    pIVar9 = *ppIVar10;
    if ((pIVar9->Active != true) || ((pIVar9->Flags & 0x1000000) == 0)) {
      AddWindowToSortBuffer(this,pIVar9);
    }
  }
  if (this->Size == iVar12) {
    ImVector<ImGuiWindow_*>::swap(this_00,this);
    (pIVar5->IO).MetricsActiveWindows = pIVar5->WindowsActiveCount;
    ((pIVar5->IO).Fonts)->Locked = false;
    (pIVar5->IO).MouseWheel = 0.0;
    (pIVar5->IO).MouseWheelH = 0.0;
    ImVector<unsigned_short>::resize(&(pIVar5->IO).InputQueueCharacters,0);
    (pIVar5->IO).NavInputs[0x10] = 0.0;
    (pIVar5->IO).NavInputs[0x11] = 0.0;
    (pIVar5->IO).NavInputs[0x12] = 0.0;
    (pIVar5->IO).NavInputs[0x13] = 0.0;
    (pIVar5->IO).NavInputs[0xc] = 0.0;
    (pIVar5->IO).NavInputs[0xd] = 0.0;
    (pIVar5->IO).NavInputs[0xe] = 0.0;
    (pIVar5->IO).NavInputs[0xf] = 0.0;
    (pIVar5->IO).NavInputs[8] = 0.0;
    (pIVar5->IO).NavInputs[9] = 0.0;
    (pIVar5->IO).NavInputs[10] = 0.0;
    (pIVar5->IO).NavInputs[0xb] = 0.0;
    (pIVar5->IO).NavInputs[4] = 0.0;
    (pIVar5->IO).NavInputs[5] = 0.0;
    (pIVar5->IO).NavInputs[6] = 0.0;
    (pIVar5->IO).NavInputs[7] = 0.0;
    (pIVar5->IO).NavInputs[0] = 0.0;
    (pIVar5->IO).NavInputs[1] = 0.0;
    (pIVar5->IO).NavInputs[2] = 0.0;
    (pIVar5->IO).NavInputs[3] = 0.0;
    (pIVar5->IO).NavInputs[0x14] = 0.0;
    return;
  }
  __assert_fail("g.Windows.Size == g.WindowsSortBuffer.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                ,0x1026,"void ImGui::EndFrame()");
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    if (g.FrameCountEnded == g.FrameCount)          // Don't process EndFrame() multiple times.
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f))
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    ErrorCheckEndFrame();

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Show CTRL+TAB list window
    if (g.NavWindowingTarget != NULL)
        NavUpdateWindowingOverlay();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount)
    {
        g.DragDropWithinSourceOrTarget = true;
        SetTooltip("...");
        g.DragDropWithinSourceOrTarget = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because childs may not exist yet
    g.WindowsSortBuffer.resize(0);
    g.WindowsSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsSortBuffer.Size);
    g.Windows.swap(g.WindowsSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));
}